

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     TersePrintPrefixToStrings<std::tuple<google::protobuf::internal::TcParseTable<0ul,10ul,0ul,0ul,8ul>*,int,int*>,2ul>
               (Strings *t,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *param_2)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  __tuple_element_t<1UL,_tuple<TcParseTable<0UL,_10UL,_0UL,_0UL,_8UL>_*,_int,_int_*>_> *value;
  ostream *local_1e8;
  value_type local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream aoStack_1a0 [384];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  Strings *strings_local;
  tuple<google::protobuf::internal::TcParseTable<0UL,_10UL,_0UL,_0UL,_8UL>_*,_int,_int_*> *t_local;
  
  local_20 = param_2;
  strings_local = t;
  TersePrintPrefixToStrings<std::tuple<google::protobuf::internal::TcParseTable<0ul,10ul,0ul,0ul,8ul>*,int,int*>,1ul>
            (t,param_2);
  std::__cxx11::stringstream::stringstream(local_1b0);
  value = std::get<1ul,google::protobuf::internal::TcParseTable<0ul,10ul,0ul,0ul,8ul>*,int,int*>
                    ((tuple<google::protobuf::internal::TcParseTable<0UL,_10UL,_0UL,_0UL,_8UL>_*,_int,_int_*>
                      *)strings_local);
  local_1e8 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1b0) {
    local_1e8 = aoStack_1a0;
  }
  UniversalTersePrint<int>(value,local_1e8);
  this = local_20;
  std::__cxx11::stringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void TersePrintPrefixToStrings(const Tuple& t,
                               std::integral_constant<size_t, I>,
                               Strings* strings) {
  TersePrintPrefixToStrings(t, std::integral_constant<size_t, I - 1>(),
                            strings);
  ::std::stringstream ss;
  UniversalTersePrint(std::get<I - 1>(t), &ss);
  strings->push_back(ss.str());
}